

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_tree.c
# Opt level: O3

yajl_val yajl_tree_get(yajl_val n,char **path,yajl_type type)

{
  char *__s1;
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  
  if (path != (char **)0x0) {
    while (n != (yajl_val)0x0) {
      __s1 = *path;
      if (__s1 == (char *)0x0) {
        if (type == yajl_t_any) {
          return n;
        }
        if (n->type != type) {
          return (yajl_val)0x0;
        }
        return n;
      }
      if (n->type != yajl_t_object) {
        return (yajl_val)0x0;
      }
      pcVar1 = (n->u).number.r;
      if (pcVar1 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        pcVar2 = (n->u).string;
        pcVar4 = (char *)0x0;
        while (iVar3 = strcmp(__s1,*(char **)(pcVar2 + (long)pcVar4 * 8)), iVar3 != 0) {
          pcVar4 = pcVar4 + 1;
          if (pcVar1 == pcVar4) {
            return (yajl_val)0x0;
          }
        }
        n = (n->u).object.values[(long)pcVar4];
      }
      path = path + 1;
      if (pcVar4 == pcVar1) {
        return (yajl_val)0x0;
      }
    }
  }
  return (yajl_val)0x0;
}

Assistant:

yajl_val yajl_tree_get(yajl_val n, const char ** path, yajl_type type)
{
    if (!path) return NULL;
    while (n && *path) {
        size_t i;
        size_t len;

        if (n->type != yajl_t_object) return NULL;
        len = n->u.object.len;
        for (i = 0; i < len; i++) {
            if (!strcmp(*path, n->u.object.keys[i])) {
                n = n->u.object.values[i];
                break;
            }
        }
        if (i == len) return NULL;
        path++;
    }
    if (n && type != yajl_t_any && type != n->type) n = NULL;
    return n;
}